

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void TrackGlobalIntAssignments(ParseNodePtr pnode,ByteCodeGenerator *byteCodeGenerator)

{
  ParseNode *pPVar1;
  ParseNode *this;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  ParseNodeBin *pPVar5;
  undefined4 *puVar6;
  ParseNodeName *pPVar7;
  ParseNodeUni *pPVar8;
  Symbol *sym_1;
  ParseNodePtr lhs_1;
  Symbol *sym;
  ParseNodePtr rhs;
  ParseNodePtr lhs;
  uint nodeType;
  ByteCodeGenerator *byteCodeGenerator_local;
  ParseNodePtr pnode_local;
  
  uVar4 = ParseNode::Grfnop((uint)pnode->nop);
  if ((uVar4 & 0x20) != 0) {
    if ((uVar4 & 8) == 0) {
      if ((uVar4 & 4) != 0) {
        pPVar8 = ParseNode::AsParseNodeUni(pnode);
        pPVar1 = pPVar8->pnode1;
        if (pPVar1->nop == knopName) {
          pPVar7 = ParseNode::AsParseNodeName(pPVar1);
          TrackIntConstantsOnGlobalObject(byteCodeGenerator,pPVar7->sym);
        }
        else if ((pPVar1->nop == knopDot) &&
                (pPVar5 = ParseNode::AsParseNodeBin(pPVar1), pPVar5->pnode2->nop == knopName)) {
          TrackGlobalIntAssignmentsForknopDotProps(pPVar1,byteCodeGenerator);
        }
      }
    }
    else {
      pPVar5 = ParseNode::AsParseNodeBin(pnode);
      pPVar1 = pPVar5->pnode1;
      pPVar5 = ParseNode::AsParseNodeBin(pnode);
      this = pPVar5->pnode2;
      if ((pPVar1 == (ParseNode *)0x0) || (this == (ParseNode *)0x0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x2b4b,"(lhs && rhs)","lhs && rhs");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      if (this->nop == knopObject) {
        TrackMemberNodesInObjectForIntConstants(byteCodeGenerator,this);
      }
      else if (this->nop != knopInt) {
        if ((this->nop != knopLsh) && (this->nop != knopRsh)) {
          return;
        }
        pPVar5 = ParseNode::AsParseNodeBin(this);
        if (pPVar5->pnode1->nop != knopInt) {
          return;
        }
        pPVar5 = ParseNode::AsParseNodeBin(this);
        if (pPVar5->pnode2->nop != knopInt) {
          return;
        }
      }
      if (pPVar1->nop == knopName) {
        pPVar7 = ParseNode::AsParseNodeName(pPVar1);
        TrackIntConstantsOnGlobalObject(byteCodeGenerator,pPVar7->sym);
      }
      else if ((pPVar1->nop == knopDot) &&
              (pPVar5 = ParseNode::AsParseNodeBin(pPVar1), pPVar5->pnode2->nop == knopName)) {
        TrackGlobalIntAssignmentsForknopDotProps(pPVar1,byteCodeGenerator);
      }
    }
  }
  return;
}

Assistant:

void TrackGlobalIntAssignments(ParseNodePtr pnode, ByteCodeGenerator * byteCodeGenerator)
{
    // Track the Global Int Constant properties' assignments here.
    uint nodeType = ParseNode::Grfnop(pnode->nop);
    if (nodeType & fnopAsg)
    {
        if (nodeType & fnopBin)
        {
            ParseNodePtr lhs = pnode->AsParseNodeBin()->pnode1;
            ParseNodePtr rhs = pnode->AsParseNodeBin()->pnode2;

            Assert(lhs && rhs);

            // Don't track other than integers and objects with member nodes.
            if (rhs->nop == knopObject)
            {
                TrackMemberNodesInObjectForIntConstants(byteCodeGenerator, rhs);
            }
            else if (rhs->nop != knopInt &&
                ((rhs->nop != knopLsh && rhs->nop != knopRsh) || (rhs->AsParseNodeBin()->pnode1->nop != knopInt || rhs->AsParseNodeBin()->pnode2->nop != knopInt)))
            {
                return;
            }

            if (lhs->nop == knopName)
            {
                // Handle "a = <Integer>" cases here
                Symbol * sym = lhs->AsParseNodeName()->sym;
                TrackIntConstantsOnGlobalObject(byteCodeGenerator, sym);
            }
            else if (lhs->nop == knopDot && lhs->AsParseNodeBin()->pnode2->nop == knopName)
            {
                // Cases like "obj.a = <Integer>"
                TrackGlobalIntAssignmentsForknopDotProps(lhs, byteCodeGenerator);
            }
        }
        else if (nodeType & fnopUni)
        {
            ParseNodePtr lhs = pnode->AsParseNodeUni()->pnode1;

            if (lhs->nop == knopName)
            {
                // Cases like "a++"
                Symbol * sym = lhs->AsParseNodeName()->sym;
                TrackIntConstantsOnGlobalObject(byteCodeGenerator, sym);
            }
            else if (lhs->nop == knopDot && lhs->AsParseNodeBin()->pnode2->nop == knopName)
            {
                // Cases like "obj.a++"
                TrackGlobalIntAssignmentsForknopDotProps(lhs, byteCodeGenerator);
            }
        }
    }
}